

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int str_find_aux(lua_State *L,int find)

{
  char *__s1;
  char cVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  ulong unaff_RBP;
  ulong uVar7;
  char *pcVar8;
  long n;
  size_t sVar9;
  char *pcVar10;
  size_t lp;
  size_t ls;
  MatchState ms;
  ulong local_280;
  int local_274;
  char *local_270;
  char *local_268;
  ulong local_260;
  MatchState local_258;
  
  local_274 = find;
  local_270 = luaL_checklstring(L,1,&local_260);
  pcVar4 = luaL_checklstring(L,2,&local_280);
  lVar5 = luaL_optinteger(L,3,1);
  if (lVar5 < 0) {
    if (local_260 < (ulong)-lVar5) {
      lVar5 = 0;
    }
    else {
      lVar5 = lVar5 + local_260 + 1;
    }
  }
  n = 1;
  if ((lVar5 < 1) || (n = lVar5, lVar5 <= (long)(local_260 + 1))) {
    local_268 = pcVar4;
    if (local_274 == 0) {
LAB_00117be5:
      pcVar4 = local_270;
      cVar1 = *local_268;
      pcVar8 = local_268;
      if (cVar1 == '^') {
        pcVar8 = local_268 + 1;
        local_280 = local_280 - 1;
      }
      local_258.matchdepth = 200;
      local_258.src_init = local_270;
      local_258.src_end = local_270 + local_260;
      local_258.p_end = pcVar8 + local_280;
      local_258.L = L;
      do {
        pcVar6 = pcVar4 + n + -1;
        local_258.level = '\0';
        pcVar10 = match(&local_258,pcVar6,pcVar8);
        if (pcVar10 != (char *)0x0) {
          if (local_274 == 0) {
            uVar3 = push_captures(&local_258,pcVar6,pcVar10);
            unaff_RBP = (ulong)uVar3;
          }
          else {
            lua_pushinteger(L,n);
            lua_pushinteger(L,(long)pcVar10 - (long)local_270);
            iVar2 = push_captures(&local_258,(char *)0x0,(char *)0x0);
            unaff_RBP = (ulong)(iVar2 + 2);
          }
        }
        if (pcVar10 != (char *)0x0) {
          return (int)unaff_RBP;
        }
      } while ((cVar1 != '^') && (n = n + 1, pcVar6 < local_258.src_end));
    }
    else {
      iVar2 = lua_toboolean(L,4);
      uVar7 = local_280;
      if (iVar2 == 0) {
        unaff_RBP = 0;
        do {
          pcVar4 = local_268 + unaff_RBP;
          pcVar8 = strpbrk(pcVar4,"^$*+?.([%-");
          if (pcVar8 != (char *)0x0) goto LAB_00117be5;
          sVar9 = strlen(pcVar4);
          unaff_RBP = unaff_RBP + sVar9 + 1;
        } while (unaff_RBP <= uVar7);
      }
      pcVar4 = local_270 + n + -1;
      if (local_280 != 0) {
        uVar7 = (local_260 - n) + 1;
        if (local_280 <= uVar7) {
          sVar9 = local_280 - 1;
          pcVar8 = (char *)(uVar7 - sVar9);
          if (pcVar8 != (char *)0x0) {
            cVar1 = *local_268;
            pcVar10 = local_268 + 1;
            pcVar6 = pcVar4;
            do {
              pcVar4 = (char *)memchr(pcVar6,(int)cVar1,(size_t)pcVar8);
              if (pcVar4 == (char *)0x0) break;
              __s1 = pcVar4 + 1;
              iVar2 = bcmp(__s1,pcVar10,sVar9);
              if (iVar2 == 0) goto LAB_00117b66;
              pcVar8 = pcVar6 + ((long)pcVar8 - (long)__s1);
              pcVar6 = __s1;
            } while (pcVar8 != (char *)0x0);
          }
        }
        pcVar4 = (char *)0x0;
      }
LAB_00117b66:
      pcVar8 = local_270;
      if (pcVar4 != (char *)0x0) {
        lua_pushinteger(L,(lua_Integer)(pcVar4 + (1 - (long)local_270)));
        lua_pushinteger(L,(lua_Integer)(pcVar4 + (local_280 - (long)pcVar8)));
        return 2;
      }
    }
  }
  lua_pushnil(L);
  return 1;
}

Assistant:

static int str_find_aux(lua_State *L, int find) {
    size_t ls, lp;
    const char *s = luaL_checklstring(L, 1, &ls);
    const char *p = luaL_checklstring(L, 2, &lp);
    lua_Integer init = posrelat(luaL_optinteger(L, 3, 1), ls);
    if (init < 1) init = 1;
    else if (init > (lua_Integer) ls + 1) {  /* start after string's end? */
        lua_pushnil(L);  /* cannot find anything */
        return 1;
    }
    /* explicit request or no special characters? */
    if (find && (lua_toboolean(L, 4) || nospecials(p, lp))) {
        /* do a plain search */
        const char *s2 = lmemfind(s + init - 1, ls - (size_t) init + 1, p, lp);
        if (s2) {
            lua_pushinteger(L, (s2 - s) + 1);
            lua_pushinteger(L, (s2 - s) + lp);
            return 2;
        }
    } else {
        MatchState ms;
        const char *s1 = s + init - 1;
        int anchor = (*p == '^');
        if (anchor) {
            p++;
            lp--;  /* skip anchor character */
        }
        prepstate(&ms, L, s, ls, p, lp);
        do {
            const char *res;
            reprepstate(&ms);
            if ((res = match(&ms, s1, p)) != NULL) {
                if (find) {
                    lua_pushinteger(L, (s1 - s) + 1);  /* start */
                    lua_pushinteger(L, res - s);   /* end */
                    return push_captures(&ms, NULL, 0) + 2;
                } else
                    return push_captures(&ms, s1, res);
            }
        } while (s1++ < ms.src_end && !anchor);
    }
    lua_pushnil(L);  /* not found */
    return 1;
}